

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O2

value_type * __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>
::fastAccessDx(value_type *__return_storage_ptr__,
              FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>
              *this,int i)

{
  Fad<double> *pFVar1;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> local_90;
  value_type local_80;
  value_type local_60;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> local_40;
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
  local_30;
  
  FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>,_Fad<Fad<double>_>_>
  ::fastAccessDx(&local_60,&this->left_->fadexpr_,i);
  local_90.fadexpr_.right_ = &this->right_->val_;
  pFVar1 = (this->right_->dx_).ptr_to_data;
  local_90.fadexpr_.left_ = &local_60;
  FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>,_Fad<Fad<double>_>_>
  ::val(&local_80,&this->left_->fadexpr_);
  local_40.fadexpr_.left_ = pFVar1 + i;
  local_30.fadexpr_.right_ = &local_40;
  local_30.fadexpr_.left_ = &local_90;
  local_40.fadexpr_.right_ = &local_80;
  Fad<double>::
  Fad<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>,FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>>>
            (__return_storage_ptr__,&local_30);
  Fad<double>::~Fad(&local_80);
  Fad<double>::~Fad(&local_60);
  return __return_storage_ptr__;
}

Assistant:

value_type fastAccessDx(int i) const { return left_.fastAccessDx(i) * right_.val() + right_.fastAccessDx(i) * left_.val();}